

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O2

void HTS_PStreamSet_clear(HTS_PStreamSet *pss)

{
  HTS_PStream *ptr;
  double *pdVar1;
  double **ppdVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (pss->pstream != (HTS_PStream *)0x0) {
    for (uVar4 = 0; ptr = pss->pstream, uVar4 < pss->nstream; uVar4 = uVar4 + 1) {
      pdVar1 = ptr[uVar4].sm.wum;
      if (pdVar1 != (double *)0x0) {
        HTS_free(pdVar1);
      }
      pdVar1 = ptr[uVar4].sm.g;
      if (pdVar1 != (double *)0x0) {
        HTS_free(pdVar1);
      }
      ppdVar2 = ptr[uVar4].sm.wuw;
      if (ppdVar2 != (double **)0x0) {
        HTS_free_matrix(ppdVar2,ptr[uVar4].length);
      }
      ppdVar2 = ptr[uVar4].sm.ivar;
      if (ppdVar2 != (double **)0x0) {
        HTS_free_matrix(ppdVar2,ptr[uVar4].length);
      }
      ppdVar2 = ptr[uVar4].sm.mean;
      if (ppdVar2 != (double **)0x0) {
        HTS_free_matrix(ppdVar2,ptr[uVar4].length);
      }
      if (ptr[uVar4].par != (double **)0x0) {
        HTS_free_matrix(ptr[uVar4].par,ptr[uVar4].length);
      }
      if (ptr[uVar4].msd_flag != (HTS_Boolean *)0x0) {
        HTS_free(ptr[uVar4].msd_flag);
      }
      if (ptr[uVar4].win_coefficient != (double **)0x0) {
        for (uVar3 = 0; uVar3 < ptr[uVar4].win_size; uVar3 = uVar3 + 1) {
          ptr[uVar4].win_coefficient[uVar3] =
               ptr[uVar4].win_coefficient[uVar3] + ptr[uVar4].win_l_width[uVar3];
          HTS_free(ptr[uVar4].win_coefficient[uVar3]);
        }
      }
      if (ptr[uVar4].gv_mean != (double *)0x0) {
        HTS_free(ptr[uVar4].gv_mean);
      }
      if (ptr[uVar4].gv_vari != (double *)0x0) {
        HTS_free(ptr[uVar4].gv_vari);
      }
      if (ptr[uVar4].win_coefficient != (double **)0x0) {
        HTS_free(ptr[uVar4].win_coefficient);
      }
      if (ptr[uVar4].win_l_width != (int *)0x0) {
        HTS_free(ptr[uVar4].win_l_width);
      }
      if (ptr[uVar4].win_r_width != (int *)0x0) {
        HTS_free(ptr[uVar4].win_r_width);
      }
      if (ptr[uVar4].gv_switch != (HTS_Boolean *)0x0) {
        HTS_free(ptr[uVar4].gv_switch);
      }
    }
    HTS_free(ptr);
  }
  pss->pstream = (HTS_PStream *)0x0;
  pss->nstream = 0;
  pss->total_frame = 0;
  return;
}

Assistant:

void HTS_PStreamSet_clear(HTS_PStreamSet * pss)
{
   size_t i, j;
   HTS_PStream *pstream;

   if (pss->pstream) {
      for (i = 0; i < pss->nstream; i++) {
         pstream = &pss->pstream[i];
         if (pstream->sm.wum)
            HTS_free(pstream->sm.wum);
         if (pstream->sm.g)
            HTS_free(pstream->sm.g);
         if (pstream->sm.wuw)
            HTS_free_matrix(pstream->sm.wuw, pstream->length);
         if (pstream->sm.ivar)
            HTS_free_matrix(pstream->sm.ivar, pstream->length);
         if (pstream->sm.mean)
            HTS_free_matrix(pstream->sm.mean, pstream->length);
         if (pstream->par)
            HTS_free_matrix(pstream->par, pstream->length);
         if (pstream->msd_flag)
            HTS_free(pstream->msd_flag);
         if (pstream->win_coefficient) {
            for (j = 0; j < pstream->win_size; j++) {
               pstream->win_coefficient[j] += pstream->win_l_width[j];
               HTS_free(pstream->win_coefficient[j]);
            }
         }
         if (pstream->gv_mean)
            HTS_free(pstream->gv_mean);
         if (pstream->gv_vari)
            HTS_free(pstream->gv_vari);
         if (pstream->win_coefficient)
            HTS_free(pstream->win_coefficient);
         if (pstream->win_l_width)
            HTS_free(pstream->win_l_width);
         if (pstream->win_r_width)
            HTS_free(pstream->win_r_width);
         if (pstream->gv_switch)
            HTS_free(pstream->gv_switch);
      }
      HTS_free(pss->pstream);
   }
   HTS_PStreamSet_initialize(pss);
}